

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::plot_explicit(Plotter *this,size_t funcid,bool reverse_xy)

{
  Environment *env;
  pointer *ppPVar1;
  undefined4 uVar2;
  color *pcVar3;
  pointer pUVar4;
  undefined4 uVar5;
  size_t sVar6;
  iterator iVar7;
  bool bVar8;
  pointer pUVar9;
  undefined1 auVar10 [16];
  void *pvVar11;
  undefined8 uVar12;
  pointer pAVar13;
  pointer pAVar14;
  _Rb_tree_node_base *p_Var15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  _Rb_tree_node_base *p_Var21;
  _Rb_tree_node_base *p_Var22;
  _Base_ptr p_Var23;
  const_iterator cVar24;
  pointer pbVar25;
  byte bVar26;
  uint uVar27;
  undefined7 in_register_00000011;
  long lVar28;
  undefined1 in_R9B;
  int sx;
  int iVar29;
  pointer this_00;
  pointer pbVar30;
  CritPoint *x;
  Expr *pEVar31;
  float fVar32;
  double dVar33;
  pointer pFVar34;
  undefined8 uVar35;
  double dVar36;
  Plotter *pPVar37;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double __tmp_1;
  undefined1 auVar38 [16];
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  float fVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  float fVar48;
  double __tmp;
  initializer_list<nivalis::Expr::ASTNode> __l;
  pair<std::_Rb_tree_iterator<std::pair<double,_int>_>,_std::_Rb_tree_iterator<std::pair<double,_int>_>_>
  pVar49;
  ASTNode AVar50;
  uint64_t var;
  double xmin;
  double xmax;
  anon_class_56_7_ff8e18dd draw_extremum;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> to_erase;
  CritPoint cpt;
  Expr diff_sub_expr;
  double MIN_DIST_BETWEEN_ROOTS;
  double ydiff;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  roots_and_extrema;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  discont;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> curr_line;
  anon_class_48_6_1545724e draw_line;
  anon_class_24_3_b7f96783 push_critpt_if_valid;
  color ineq_color;
  undefined1 in_stack_fffffffffffffca8;
  bool local_352;
  byte local_351;
  undefined1 local_348 [8];
  color *local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  Plotter *local_318;
  Plotter *local_310;
  undefined8 local_308;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined1 local_2f8 [32];
  pointer pSStack_2d8;
  pointer pSStack_2d0;
  pointer local_2c8;
  pointer local_2c0;
  undefined1 local_2b8 [16];
  _Rb_tree_node_base *local_2a8;
  _Rb_tree_node_base *local_2a0;
  _Rb_tree_node_base *local_298;
  _Alloc_hider local_290;
  undefined1 local_288 [24];
  Expr *local_270;
  Expr *local_268;
  float local_260;
  allocator_type local_259;
  Expr local_258;
  float local_238;
  undefined4 uStack_234;
  pointer local_230;
  float local_228;
  float fStack_224;
  undefined8 uStack_220;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  pointer local_1f8;
  color *local_1f0;
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [8];
  undefined1 local_1b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  Expr *local_190;
  float local_188;
  float local_184;
  undefined1 local_180 [8];
  _Rb_tree_node_base local_178;
  size_t local_158;
  undefined1 local_150 [72];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_108;
  undefined1 local_f0 [32];
  pointer pPStack_d0;
  undefined1 local_c8 [16];
  color *local_b0;
  anon_class_48_6_1545724e local_a8;
  anon_class_24_3_b7f96783 local_78;
  color local_60;
  
  pFVar34 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar19 = ((long)(this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pFVar34 >> 4) * -0x79435e50d79435e5;
  local_351 = this->max_functions_find_all_crit_points <= uVar19 &&
              uVar19 - this->max_functions_find_all_crit_points != 0;
  sVar6 = this->curr_func;
  pcVar3 = (color *)(this->view).xmax;
  pUVar4 = (pointer)(this->view).xmin;
  local_1b8._16_8_ = (double)pcVar3 - (double)pUVar4;
  local_1f0 = (color *)(this->view).ymax;
  local_150._64_8_ = (this->view).ymin;
  pUVar9 = (pointer)((double)local_1f0 - (double)local_150._64_8_);
  uVar2 = (this->view).swid;
  uVar5 = (this->view).shigh;
  fStack_224 = (float)(int)uVar2;
  uVar18 = this->x_var;
  local_348 = (undefined1  [8])pUVar4;
  local_340 = pcVar3;
  local_1c0 = (undefined1  [8])pUVar9;
  local_228 = (float)(int)uVar5;
  if ((int)CONCAT71(in_register_00000011,reverse_xy) != 0) {
    uVar18 = this->y_var;
    local_348 = (undefined1  [8])local_150._64_8_;
    local_340 = local_1f0;
    local_1f0 = pcVar3;
    local_1c0 = (undefined1  [8])local_1b8._16_8_;
    local_1b8._16_8_ = pUVar9;
    local_150._64_8_ = pUVar4;
    local_228 = fStack_224;
    fStack_224 = (float)(int)uVar5;
  }
  uVar19 = (ulong)uVar18;
  uStack_220 = 0;
  this_00 = pFVar34 + funcid;
  local_b0 = &pFVar34[funcid].line_color;
  local_352 = reverse_xy;
  local_1e8._0_8_ = funcid;
  color::color::color(&local_60,local_b0);
  *local_60.a = 0.25;
  local_230 = (pointer)((double)local_1b8._16_8_ * 1e-07);
  local_210 = (pointer)local_1c0;
  local_78.MIN_DIST_BETWEEN_ROOTS = (double *)&local_230;
  (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->y_var] = NAN;
  local_150._24_8_ = local_150 + 8;
  local_150._8_4_ = _S_red;
  local_150._16_8_ = (_Rb_tree_node_base *)0x0;
  local_150._40_8_ = 0;
  local_178._M_left = &local_178;
  local_178._M_color = _S_red;
  local_178._M_parent = (_Rb_tree_node_base *)0x0;
  local_158 = 0;
  local_78.xmin = (double *)local_348;
  local_78.xmax = (double *)&local_340;
  local_a8.curr_line = &local_108;
  local_108.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.reverse_xy = &local_352;
  local_a8.funcid = (size_t *)local_1e8;
  local_270 = &pFVar34[funcid].diff;
  local_2c0 = this_00;
  local_200 = local_230;
  local_178._M_right = local_178._M_left;
  local_150._32_8_ = local_150._24_8_;
  local_a8.func = this_00;
  local_a8.this = this;
  local_a8.ineq_color = &local_60;
  bVar16 = Expr::is_null(local_270);
  bVar26 = local_351 & sVar6 != funcid;
  local_1f8 = (pointer)((double)local_1b8._16_8_ / 20.0);
  local_208 = (pointer)((double)local_210 * 1e-10);
  local_1e8._16_8_ = (pointer)0x3e112e0be826d695;
  env = &this->env;
  if (((!bVar16) &&
      (uVar20 = ((long)(this->funcs).
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->funcs).
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
      uVar20 < this->max_functions_find_crit_points ||
      uVar20 - this->max_functions_find_crit_points == 0)) &&
     (local_c8._4_4_ = fStack_224, local_c8._0_4_ = fStack_224, local_c8._8_4_ = fStack_224,
     local_c8._12_4_ = fStack_224, 0.0 < fStack_224)) {
    local_1e8._32_8_ = (double)local_1b8._16_8_ * 1e-09;
    this_00 = (pointer)&local_2c0->expr;
    local_190 = &local_2c0->recip;
    local_f0._24_8_ = &local_2c0->drecip;
    local_268 = &local_2c0->ddiff;
    iVar29 = 0;
    dVar33 = 0.0;
    uVar35 = 0;
    do {
      local_338._8_8_ = uVar35;
      local_338._0_8_ = dVar33;
      local_310 = local_318;
      if (local_352 == true) {
        iVar17 = (this->view).shigh;
        dVar33 = (this->view).ymin;
        dVar36 = ((this->view).ymax - dVar33) * (double)(iVar17 - iVar29);
      }
      else {
        dVar33 = (this->view).xmin;
        dVar36 = ((this->view).xmax - dVar33) * (double)iVar29;
        iVar17 = (this->view).swid;
      }
      local_318 = (Plotter *)(dVar36 / (double)iVar17 + dVar33);
      (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar19] = (double)local_318;
      local_1b8._0_8_ = Expr::operator()((Expr *)this_00,env);
      local_1b8._8_8_ = extraout_XMM0_Qb;
      if (!NAN((double)local_1b8._0_8_)) {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar19] = (double)local_318;
        dVar33 = Expr::operator()(local_270,env);
        if (!NAN(dVar33)) {
          local_328._8_8_ = extraout_XMM0_Qb_00;
          local_328._0_8_ = dVar33;
          if (bVar26 == 0) {
            local_2f8._0_8_ =
                 Expr::newton((Expr *)this_00,uVar19,(double)local_318,env,(double)local_200,
                              (double)local_208,100,(double)local_348 - (double)local_1f8,
                              (double)local_340 + (double)local_1f8,local_270,
                              (double)local_1b8._0_8_,dVar33);
            local_2f8._8_4_ = 3;
            if ((((ulong)ABS((double)local_2f8._0_8_) < 0x7ff0000000000000) &&
                ((double)local_348 <= (double)local_2f8._0_8_)) &&
               ((double)local_2f8._0_8_ <= (double)local_340)) {
              p_Var22 = &local_178;
              if (local_178._M_parent != (_Rb_tree_node_base *)0x0) {
                p_Var22 = &local_178;
                p_Var21 = local_178._M_parent;
                do {
                  if ((*(double *)(p_Var21 + 1) < (double)local_2f8._0_8_) ||
                     ((lVar28 = 0x10, p_Var15 = p_Var21,
                      *(double *)(p_Var21 + 1) <= (double)local_2f8._0_8_ &&
                      (*(int *)&p_Var21[1]._M_parent < 3)))) {
                    lVar28 = 0x18;
                    p_Var15 = p_Var22;
                  }
                  p_Var22 = p_Var15;
                  p_Var21 = *(_Rb_tree_node_base **)((long)&p_Var21->_M_color + lVar28);
                } while (p_Var21 != (_Rb_tree_node_base *)0x0);
              }
              pFVar34 = (pointer)0x3ff0000000000000;
              if (p_Var22 != &local_178) {
                pFVar34 = (pointer)(*(double *)(p_Var22 + 1) - (double)local_2f8._0_8_);
              }
              if (p_Var22 != local_178._M_left) {
                local_308 = pFVar34;
                _local_238 = local_2f8._0_8_;
                lVar28 = std::_Rb_tree_decrement(p_Var22);
                pFVar34 = (pointer)((double)_local_238 - *(double *)(lVar28 + 0x20));
                if ((double)local_308 <= (double)pFVar34) {
                  pFVar34 = local_308;
                }
              }
              if ((double)local_230 <= (double)pFVar34) {
                std::
                _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                ::_M_insert_unique<std::pair<double,int>const&>
                          ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                            *)local_180,(pair<double,_int> *)local_2f8);
              }
            }
            dVar33 = (double)local_328._0_8_;
          }
          local_2f8._0_8_ =
               Expr::newton(local_190,uVar19,(double)local_318,env,(double)local_200,
                            (double)local_208,100,(double)local_348 - (double)local_1f8,
                            (double)local_340 + (double)local_1f8,(Expr *)local_f0._24_8_,
                            1.0 / (double)local_1b8._0_8_,
                            -dVar33 / ((double)local_1b8._0_8_ * (double)local_1b8._0_8_));
          local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffff00000000;
          if ((((ulong)ABS((double)local_2f8._0_8_) < 0x7ff0000000000000) &&
              ((double)local_348 <= (double)local_2f8._0_8_)) &&
             ((double)local_2f8._0_8_ <= (double)local_340)) {
            p_Var22 = (_Rb_tree_node_base *)(local_150 + 8);
            if ((_Rb_tree_node_base *)local_150._16_8_ != (_Rb_tree_node_base *)0x0) {
              p_Var22 = (_Rb_tree_node_base *)(local_150 + 8);
              p_Var21 = (_Rb_tree_node_base *)local_150._16_8_;
              do {
                if ((*(double *)(p_Var21 + 1) < (double)local_2f8._0_8_) ||
                   ((lVar28 = 0x10, p_Var15 = p_Var21,
                    *(double *)(p_Var21 + 1) <= (double)local_2f8._0_8_ &&
                    (*(int *)&p_Var21[1]._M_parent < 0)))) {
                  lVar28 = 0x18;
                  p_Var15 = p_Var22;
                }
                p_Var22 = p_Var15;
                p_Var21 = *(_Rb_tree_node_base **)((long)&p_Var21->_M_color + lVar28);
              } while (p_Var21 != (_Rb_tree_node_base *)0x0);
            }
            pFVar34 = (pointer)0x3ff0000000000000;
            if (p_Var22 != (_Rb_tree_node_base *)(local_150 + 8)) {
              pFVar34 = (pointer)(*(double *)(p_Var22 + 1) - (double)local_2f8._0_8_);
            }
            if (p_Var22 != (_Rb_tree_node_base *)local_150._24_8_) {
              local_308 = pFVar34;
              _local_238 = local_2f8._0_8_;
              lVar28 = std::_Rb_tree_decrement(p_Var22);
              pFVar34 = (pointer)((double)_local_238 - *(double *)(lVar28 + 0x20));
              if ((double)local_308 <= (double)pFVar34) {
                pFVar34 = local_308;
              }
            }
            if ((double)local_230 <= (double)pFVar34) {
              std::
              _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              ::_M_insert_unique<std::pair<double,int>const&>
                        ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                          *)local_150,(pair<double,_int> *)local_2f8);
            }
          }
          if (bVar26 == 0) {
            (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = (double)local_318;
            dVar33 = Expr::operator()(local_268,env);
            if (!NAN(dVar33)) {
              local_2f8._0_8_ =
                   Expr::newton(local_270,uVar19,(double)local_318,env,(double)local_200,
                                (double)local_208,100,(double)local_348 - (double)local_1f8,
                                (double)local_340 + (double)local_1f8,local_268,
                                (double)local_328._0_8_,dVar33);
              local_2f8._8_4_ = 4;
              if ((((ulong)ABS((double)local_2f8._0_8_) < 0x7ff0000000000000) &&
                  ((double)local_348 <= (double)local_2f8._0_8_)) &&
                 ((double)local_2f8._0_8_ <= (double)local_340)) {
                p_Var22 = &local_178;
                if (local_178._M_parent != (_Rb_tree_node_base *)0x0) {
                  p_Var22 = &local_178;
                  p_Var21 = local_178._M_parent;
                  do {
                    if ((*(double *)(p_Var21 + 1) < (double)local_2f8._0_8_) ||
                       ((lVar28 = 0x10, p_Var15 = p_Var21,
                        *(double *)(p_Var21 + 1) <= (double)local_2f8._0_8_ &&
                        (*(int *)&p_Var21[1]._M_parent < 4)))) {
                      lVar28 = 0x18;
                      p_Var15 = p_Var22;
                    }
                    p_Var22 = p_Var15;
                    p_Var21 = *(_Rb_tree_node_base **)((long)&p_Var21->_M_color + lVar28);
                  } while (p_Var21 != (_Rb_tree_node_base *)0x0);
                }
                dVar33 = 1.0;
                if (p_Var22 != &local_178) {
                  dVar33 = *(double *)(p_Var22 + 1) - (double)local_2f8._0_8_;
                }
                if (p_Var22 != local_178._M_left) {
                  local_328._0_8_ = dVar33;
                  local_308 = (pointer)local_2f8._0_8_;
                  lVar28 = std::_Rb_tree_decrement(p_Var22);
                  dVar33 = (double)local_308 - *(double *)(lVar28 + 0x20);
                  if ((double)local_328._0_8_ <= dVar33) {
                    dVar33 = (double)local_328._0_8_;
                  }
                }
                if ((double)local_230 <= dVar33) {
                  std::
                  _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                  ::_M_insert_unique<std::pair<double,int>const&>
                            ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                              *)local_180,(pair<double,_int> *)local_2f8);
                }
              }
            }
          }
        }
      }
      if ((iVar29 != 0) && (NAN((double)local_338._0_8_) != NAN((double)local_1b8._0_8_))) {
        uVar39 = SUB84(local_310,0);
        uVar40 = (undefined4)((ulong)local_310 >> 0x20);
        uVar41 = 0;
        uVar42 = 0;
        uVar43 = SUB84(local_318,0);
        uVar45 = (undefined4)((ulong)local_318 >> 0x20);
        if ((double)local_318 - (double)local_310 <= (double)local_1e8._32_8_) {
          uVar46 = 0;
          uVar47 = 0;
        }
        else {
          uVar46 = 0;
          uVar47 = 0;
          pPVar37 = local_310;
          do {
            local_308 = (pointer)CONCAT44(uVar45,uVar43);
            dVar33 = ((double)CONCAT44(uVar45,uVar43) + (double)pPVar37) * 0.5;
            local_328._8_4_ = uVar46;
            local_328._0_8_ = dVar33;
            local_328._12_4_ = uVar47;
            (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = dVar33;
            local_310 = pPVar37;
            uStack_300 = uVar46;
            uStack_2fc = uVar47;
            dVar33 = Expr::operator()((Expr *)this_00,env);
            if (NAN(dVar33) == NAN((double)local_338._0_8_)) {
              uVar39 = local_328._0_4_;
              uVar40 = local_328._4_4_;
              uVar41 = local_328._8_4_;
              uVar42 = local_328._12_4_;
              uVar43 = (float)local_308;
              uVar45 = local_308._4_4_;
              uVar46 = uStack_300;
              uVar47 = uStack_2fc;
              pPVar37 = local_328._0_8_;
            }
            else {
              uVar39 = SUB84(local_310,0);
              uVar40 = (undefined4)((ulong)local_310 >> 0x20);
              uVar41 = 0;
              uVar42 = 0;
              uVar43 = local_328._0_4_;
              uVar45 = local_328._4_4_;
              uVar46 = local_328._8_4_;
              uVar47 = local_328._12_4_;
              pPVar37 = local_310;
            }
          } while ((double)local_1e8._32_8_ <
                   (double)CONCAT44(uVar45,uVar43) - (double)CONCAT44(uVar40,uVar39));
        }
        uVar20 = CONCAT44(uVar47,uVar46) & local_338._8_8_;
        auVar38._0_8_ = ~-(ulong)NAN((double)local_338._0_8_) & CONCAT44(uVar40,uVar39);
        auVar38._8_8_ = ~local_338._8_8_ & CONCAT44(uVar42,uVar41);
        auVar10._8_4_ = (int)uVar20;
        auVar10._0_8_ = CONCAT44(uVar45,uVar43) & -(ulong)NAN((double)local_338._0_8_);
        auVar10._12_4_ = (int)(uVar20 >> 0x20);
        auVar38 = auVar38 | auVar10;
        local_2f8._0_8_ = auVar38._0_8_;
        local_2f8._8_4_ = 1;
        if ((((ulong)ABS((double)local_2f8._0_8_) < 0x7ff0000000000000) &&
            ((double)local_348 <= (double)local_2f8._0_8_)) &&
           ((double)local_2f8._0_8_ <= (double)local_340)) {
          p_Var22 = (_Rb_tree_node_base *)(local_150 + 8);
          if ((_Rb_tree_node_base *)local_150._16_8_ != (_Rb_tree_node_base *)0x0) {
            p_Var22 = (_Rb_tree_node_base *)(local_150 + 8);
            p_Var21 = (_Rb_tree_node_base *)local_150._16_8_;
            do {
              if ((*(double *)(p_Var21 + 1) < (double)local_2f8._0_8_) ||
                 ((lVar28 = 0x10, p_Var15 = p_Var21,
                  *(double *)(p_Var21 + 1) <= (double)local_2f8._0_8_ &&
                  (*(int *)&p_Var21[1]._M_parent < 1)))) {
                lVar28 = 0x18;
                p_Var15 = p_Var22;
              }
              p_Var22 = p_Var15;
              p_Var21 = *(_Rb_tree_node_base **)((long)&p_Var21->_M_color + lVar28);
            } while (p_Var21 != (_Rb_tree_node_base *)0x0);
          }
          dVar33 = 1.0;
          if (p_Var22 != (_Rb_tree_node_base *)(local_150 + 8)) {
            dVar33 = *(double *)(p_Var22 + 1) - (double)local_2f8._0_8_;
          }
          local_338 = auVar38;
          if (p_Var22 != (_Rb_tree_node_base *)local_150._24_8_) {
            local_328._0_8_ = dVar33;
            lVar28 = std::_Rb_tree_decrement(p_Var22);
            dVar33 = (double)local_338._0_8_ - *(double *)(lVar28 + 0x20);
            if ((double)local_328._0_8_ <= dVar33) {
              dVar33 = (double)local_328._0_8_;
            }
          }
          if ((double)local_230 <= dVar33) {
            std::
            _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
            ::_M_insert_unique<std::pair<double,int>const&>
                      ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                        *)local_150,(pair<double,_int> *)local_2f8);
          }
        }
      }
      iVar29 = iVar29 + 4;
      dVar33 = (double)local_1b8._0_8_;
      uVar35 = local_1b8._8_8_;
    } while ((float)iVar29 < local_c8._0_4_);
  }
  local_2f8._0_4_ = DISCONT_SCREEN;
  std::
  set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
  ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
            ((set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              *)local_150,(double *)local_348,(anon_enum_32 *)local_2f8);
  local_2f8._0_4_ = 2;
  local_351 = bVar26;
  std::
  set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
  ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
            ((set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              *)local_150,(double *)&local_340,(anon_enum_32 *)local_2f8);
  uVar35 = local_1b8._16_8_;
  if ((_Rb_tree_node_base *)local_150._24_8_ != (_Rb_tree_node_base *)(local_150 + 8)) {
    local_150._56_8_ = (double)local_1b8._16_8_ * 1e-06;
    local_150._48_8_ = (double)local_1b8._16_8_ * 1e-05;
    local_1e8._16_8_ = (double)local_1e8._16_8_ * (double)local_210;
    local_210 = (pointer)((double)local_210 * 0.001);
    local_184 = (float)((double)local_1b8._16_8_ * 9.999999747378752e-05);
    pEVar31 = &local_2c0->expr;
    uVar20 = 0;
    p_Var22 = (_Rb_tree_node_base *)local_150._24_8_;
    uVar35 = local_348;
    do {
      fVar44 = local_268._0_4_;
      local_1b8._0_4_ = local_268._0_4_;
      aStack_1a0._8_8_ = *(undefined8 *)(p_Var22 + 1);
      if (local_352 == true) {
        dVar33 = (this->view).ymax;
        dVar36 = (double)(this->view).shigh * (dVar33 - (double)aStack_1a0._8_8_);
        dVar33 = dVar33 - (this->view).ymin;
      }
      else {
        dVar33 = (this->view).xmin;
        dVar36 = (double)(this->view).swid * ((double)aStack_1a0._8_8_ - dVar33);
        dVar33 = (this->view).xmax - dVar33;
      }
      uVar18 = *(uint *)&p_Var22[1]._M_parent;
      pFVar34 = (pointer)(ulong)uVar18;
      fVar32 = (float)(dVar36 / dVar33);
      local_268 = (Expr *)CONCAT44(local_268._4_4_,fVar32);
      local_1e8._24_8_ = uVar35;
      if (uVar20 != 0) {
        bVar16 = (int)this_00 != 2;
        if (local_352 == false) {
          uVar39 = (undefined4)uVar35;
          uVar40 = (undefined4)((ulong)uVar35 >> 0x20);
          fVar48 = fVar44;
          local_1e8._24_8_ = aStack_1a0._8_8_;
        }
        else {
          uVar39 = (undefined4)aStack_1a0._8_8_;
          uVar40 = (undefined4)((ulong)aStack_1a0._8_8_ >> 0x20);
          fVar48 = fVar32;
          fVar32 = fVar44;
        }
        local_238 = fVar48;
        fVar48 = fVar48 + local_184;
        local_318 = (Plotter *)CONCAT44(local_318._4_4_,fVar32 - local_184);
        local_328._0_4_ = 0xbf800000;
        local_308 = (pointer)CONCAT44(local_308._4_4_,0xbf800000);
        local_260 = fVar32;
        local_1e8._12_4_ = uVar18;
        if (fVar48 < fVar32 - local_184) {
          local_f0._24_8_ = local_1e8._16_8_;
          if (uVar18 != 0) {
            local_f0._24_8_ = local_210;
          }
          local_c8._0_8_ = (double)local_150._56_8_ + (double)CONCAT44(uVar40,uVar39);
          local_190 = (Expr *)((double)CONCAT44(uVar40,uVar39) + (double)local_150._48_8_);
          pPStack_d0 = (pointer)0x0;
          local_1b8._16_8_ = local_f0._24_8_ ^ 0x8000000000000000;
          aStack_1a0._M_allocated_capacity._0_4_ = 0.0;
          aStack_1a0._M_allocated_capacity._4_4_ = -0.0;
          local_308 = (pointer)CONCAT44(local_308._4_4_,0xbf800000);
          local_328._0_4_ = 0xbf800000;
          do {
            local_338._0_4_ = fVar48;
            if (local_352 == true) {
              iVar29 = (this->view).shigh;
              dVar33 = (this->view).ymin;
              dVar36 = ((this->view).ymax - dVar33) * (double)((float)iVar29 - fVar48);
            }
            else {
              dVar33 = (this->view).xmin;
              dVar36 = ((this->view).xmax - dVar33) * (double)fVar48;
              iVar29 = (this->view).swid;
            }
            (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = dVar36 / (double)iVar29 + dVar33;
            dVar33 = Expr::operator()(pEVar31,env);
            if (NAN(dVar33)) {
              local_308 = (pointer)CONCAT44(local_308._4_4_,0xbf800000);
              fVar48 = (float)local_338._0_4_;
            }
            else {
              dVar36 = (double)local_1f0 + (double)local_1c0;
              if ((dVar33 <= (double)local_1f0 + (double)local_1c0) &&
                 (dVar36 = dVar33, dVar33 < (double)local_150._64_8_ - (double)local_1c0)) {
                dVar36 = (double)local_150._64_8_ - (double)local_1c0;
              }
              if (local_352 == true) {
                dVar33 = (this->view).xmin;
                dVar36 = (double)(this->view).swid * (dVar36 - dVar33);
                dVar33 = (this->view).xmax - dVar33;
              }
              else {
                dVar33 = (this->view).ymax;
                dVar36 = (double)(this->view).shigh * (dVar33 - dVar36);
                dVar33 = dVar33 - (this->view).ymin;
              }
              local_310 = (Plotter *)CONCAT44(local_310._4_4_,(float)(dVar36 / dVar33));
              if (bVar16) {
                (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19] = (double)local_c8._0_8_;
                local_1e8._32_8_ = Expr::operator()(pEVar31,env);
                (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19] = (double)local_190;
                dVar33 = Expr::operator()(pEVar31,env);
                fVar44 = local_310._0_4_;
                if (((double)local_1e8._32_8_ - dVar33 <= (double)local_f0._24_8_) ||
                   (local_310._0_4_ <= 0.0)) {
                  bVar16 = false;
                  fVar32 = (float)local_308;
                  if (((double)local_1b8._16_8_ <= (double)local_1e8._32_8_ - dVar33) ||
                     (fVar48 = local_228, local_228 <= local_310._0_4_)) goto LAB_00143952;
                }
                else {
                  fVar48 = 0.0;
                }
                bVar16 = false;
                local_328._0_4_ = fVar48;
                fVar32 = local_238;
              }
              else {
                fVar44 = (float)(dVar36 / dVar33);
                fVar32 = (float)local_308;
              }
LAB_00143952:
              if (0.0 <= fVar32) {
                plot_explicit::anon_class_48_6_1545724e::operator()
                          (&local_a8,fVar32,(float)local_328._0_4_,(float)local_338._0_4_,fVar44);
                local_328._0_4_ = local_310._0_4_;
                local_308 = (pointer)CONCAT44(local_308._4_4_,local_338._0_4_);
                fVar48 = (float)local_338._0_4_;
              }
              else {
                local_328._0_4_ = fVar44;
                local_308 = (pointer)CONCAT44(local_308._4_4_,local_338._0_4_);
                fVar48 = (float)local_338._0_4_;
              }
            }
            fVar44 = 0.2;
            if (local_150._40_8_ - 3 < 0x61) {
              if (uVar20 != 1) {
                fVar44 = 0.1;
                if (fVar48 - (float)local_1b8._0_4_ < 1.0) goto LAB_00143a0c;
              }
              if (uVar20 < local_150._40_8_ - 1) {
                fVar44 = 0.1;
                if (local_268._0_4_ - fVar48 < 1.0) goto LAB_00143a0c;
              }
              fVar44 = 0.2;
            }
LAB_00143a0c:
            fVar48 = fVar48 + fVar44;
          } while (fVar48 < local_318._0_4_);
        }
        uVar39 = local_1e8._12_4_;
        pFVar34 = (pointer)(ulong)(uint)local_1e8._12_4_;
        if (local_1e8._12_4_ != 2) {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] =
               (double)local_1e8._24_8_ - (double)local_150._56_8_;
          dVar33 = Expr::operator()(pEVar31,env);
          local_338._0_8_ = dVar33;
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] =
               (double)local_1e8._24_8_ - (double)local_150._48_8_;
          dVar33 = Expr::operator()(pEVar31,env);
          uVar40 = (undefined4)local_1e8._16_8_;
          uVar41 = SUB84(local_1e8._16_8_,4);
          if (uVar39 != 0) {
            uVar40 = SUB84(local_210,0);
            uVar41 = (undefined4)((ulong)local_210 >> 0x20);
          }
          dVar33 = (double)local_338._0_8_ - dVar33;
          bVar16 = dVar33 == (double)CONCAT44(uVar41,uVar40);
          bVar8 = dVar33 < (double)CONCAT44(uVar41,uVar40);
          fVar44 = 0.0;
          if ((float)local_328._0_4_ <= 0.0 || (bVar8 || bVar16)) {
            fVar44 = local_188;
          }
          fVar32 = local_260;
          if ((float)local_328._0_4_ <= 0.0 || (bVar8 || bVar16)) {
            fVar32 = -1.0;
          }
          local_188 = local_228;
          if (-(double)CONCAT44(uVar41,uVar40) <= dVar33 || local_228 <= (float)local_328._0_4_) {
            local_188 = fVar44;
            local_260 = fVar32;
          }
          if ((0.0 <= (float)local_308) && (0.0 <= local_260)) {
            plot_explicit::anon_class_48_6_1545724e::operator()
                      (&local_a8,(float)local_308,(float)local_328._0_4_,local_260,local_188);
          }
        }
      }
      uVar20 = uVar20 + 1;
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
      this_00 = pFVar34;
      uVar35 = aStack_1a0._8_8_;
    } while (p_Var22 != (_Rb_tree_node_base *)(local_150 + 8));
  }
  bVar26 = local_351;
  if ((8 < (ulong)((long)local_108.
                         super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_108.
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)) && ((local_2c0->type & 2) == 0))
  {
    anon_unknown_1::buf_add_screen_polyline
              (&this->draw_buf,&this->view,&local_108,local_b0,local_1e8._0_8_,(float)uVar35,
               (bool)in_R9B,(bool)in_stack_fffffffffffffca8,SUB81(uVar19,0));
  }
  uVar20 = ((long)(this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
  if (uVar20 < this->max_functions_find_crit_points ||
      uVar20 - this->max_functions_find_crit_points == 0) {
    if (bVar26 == 0) {
      pSStack_2d0 = (pointer)local_2b8;
      local_2b8._0_8_ = (_Base_ptr)0x0;
      local_2b8._8_8_ = (_Base_ptr)0x0;
      local_2a8 = (_Rb_tree_node_base *)0x0;
      local_2f8._8_8_ = &stack0xfffffffffffffcb0;
      local_2f8._16_8_ = local_2c0;
      local_2f8._24_8_ = &local_352;
      pSStack_2d8 = (pointer)local_1c0;
      local_2c8 = (pointer)local_1e8;
      local_2f8._0_8_ = this;
      if (local_178._M_left != &local_178) {
        pEVar31 = &local_2c0->expr;
        p_Var23 = local_178._M_left;
        do {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] = *(double *)(p_Var23 + 1);
          dVar33 = Expr::operator()(pEVar31,env);
          plot_explicit::anon_class_56_7_ff8e18dd::operator()
                    ((anon_class_56_7_ff8e18dd *)local_2f8,(CritPoint *)(p_Var23 + 1),dVar33);
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        } while (p_Var23 != &local_178);
      }
      uVar35 = local_2b8._8_8_;
      if (local_2b8._0_8_ != local_2b8._8_8_) {
        p_Var23 = (_Base_ptr)local_2b8._0_8_;
        do {
          pVar49 = std::
                   _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                   ::equal_range((_Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                                  *)local_180,(key_type *)p_Var23);
          std::
          _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
          ::_M_erase_aux((_Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                          *)local_180,(_Base_ptr)pVar49.first._M_node,
                         (_Base_ptr)pVar49.second._M_node);
          p_Var23 = (_Base_ptr)&p_Var23->_M_left;
        } while (p_Var23 != (_Base_ptr)uVar35);
      }
      pEVar31 = &local_2c0->expr;
      bVar16 = Expr::is_null(pEVar31);
      if ((!bVar16) && (bVar16 = Expr::is_null(local_270), !bVar16)) {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar19] = 0.0;
        dVar33 = Expr::operator()(pEVar31,env);
        local_338._0_8_ = dVar33;
        if ((ulong)ABS(dVar33) < 0x7ff0000000000000) {
          plot_explicit::anon_class_24_3_b7f96783::operator()
                    (&local_78,0.0,5,
                     (set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                      *)local_180);
          local_288._0_8_ = (Plotter *)0x0;
          local_288._8_4_ = 5;
          cVar24 = std::
                   _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                   ::find((_Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                           *)local_180,(key_type *)local_288);
          if (cVar24._M_node != &local_178) {
            plot_explicit::anon_class_56_7_ff8e18dd::operator()
                      ((anon_class_56_7_ff8e18dd *)local_2f8,(CritPoint *)local_288,
                       (double)local_338._0_8_);
          }
        }
      }
      if ((_Base_ptr)local_2b8._0_8_ != (_Base_ptr)0x0) {
        operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
      }
    }
    bVar16 = Expr::is_null(local_270);
    if (((!bVar16) &&
        (uVar20 = ((long)(this->funcs).
                         super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->funcs).
                         super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
        (uVar20 < this->max_functions_find_crit_points ||
        uVar20 - this->max_functions_find_crit_points == 0) && (bVar26 & 1) == 0)) &&
       ((pFVar34 = (this->funcs).
                   super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl
                   .super__Vector_impl_data._M_start,
        uVar20 = ((long)(this->funcs).
                        super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar34 >> 4) *
                 -0x79435e50d79435e5,
        this->max_functions_find_all_crit_points <= uVar20 &&
        uVar20 - this->max_functions_find_all_crit_points != 0 ||
        ((pointer)local_1e8._0_8_ != (pointer)0x0)))) {
      local_328._0_8_ = &local_2c0->expr;
      local_228 = fStack_224;
      uStack_220 = CONCAT44(fStack_224,fStack_224);
      local_318 = (Plotter *)((double)local_200 * 10.0);
      local_308 = (pointer)((double)local_208 * 10.0);
      local_1f0 = (color *)&this->pt_markers;
      pbVar30 = (pointer)0x0;
      do {
        pEVar31 = &pFVar34[(long)pbVar30].diff;
        bVar16 = Expr::is_null(pEVar31);
        if (!bVar16) {
          uVar18 = local_2c0->type & 0xfffffff8;
          uVar27 = pFVar34[(long)pbVar30].type & 0xfffffff8;
          if (uVar18 == uVar27) {
            uVar35 = local_328._0_8_;
            Expr::operator-((Expr *)local_288,(Expr *)local_328._0_8_,&pFVar34[(long)pbVar30].expr);
            Expr::operator-(&local_258,local_270,pEVar31);
            bVar16 = Expr::is_null(&local_258);
            if (!bVar16) {
              local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffff00000000;
              local_2a8 = (_Rb_tree_node_base *)0x0;
              local_2a0 = (_Rb_tree_node_base *)(local_2b8 + 8);
              local_290._M_p = (pointer)0x0;
              local_298 = local_2a0;
              if (0.0 < local_228) {
                iVar29 = 0;
                do {
                  if (local_352 == true) {
                    iVar17 = (this->view).shigh;
                    dVar33 = (this->view).ymin;
                    dVar36 = ((this->view).ymax - dVar33) * (double)(iVar17 - iVar29);
                  }
                  else {
                    dVar33 = (this->view).xmin;
                    dVar36 = ((this->view).xmax - dVar33) * (double)iVar29;
                    iVar17 = (this->view).swid;
                  }
                  local_2f8._0_8_ =
                       Expr::newton((Expr *)local_288,uVar19,dVar36 / (double)iVar17 + dVar33,env,
                                    (double)local_200,(double)local_208,100,
                                    (double)local_348 - (double)local_1f8,
                                    (double)local_340 + (double)local_1f8,&local_258,
                                    1.79769313486232e+308,1.79769313486232e+308);
                  if ((((local_2f8._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                      ((double)local_348 <= (double)local_2f8._0_8_)) &&
                     ((double)local_2f8._0_8_ <= (double)local_340)) {
                    p_Var22 = (_Rb_tree_node_base *)(local_2b8 + 8);
                    for (p_Var23 = local_2a8; p_Var23 != (_Rb_tree_node_base *)0x0;
                        p_Var23 = (&p_Var23->_M_left)[bVar8 && bVar16]) {
                      bVar16 = (double)local_2f8._0_8_ != *(double *)(p_Var23 + 1);
                      bVar8 = *(double *)(p_Var23 + 1) <= (double)local_2f8._0_8_;
                      if (!bVar8 || !bVar16) {
                        p_Var22 = p_Var23;
                      }
                    }
                    dVar33 = 1.0;
                    if (p_Var22 != (_Rb_tree_node_base *)(local_2b8 + 8)) {
                      dVar33 = *(double *)(p_Var22 + 1) - (double)local_2f8._0_8_;
                    }
                    if (p_Var22 != local_2a0) {
                      local_338._0_8_ = dVar33;
                      local_310 = (Plotter *)local_2f8._0_8_;
                      lVar28 = std::_Rb_tree_decrement(p_Var22);
                      dVar33 = (double)local_310 - *(double *)(lVar28 + 0x20);
                      if ((double)local_338._0_8_ <= dVar33) {
                        dVar33 = (double)local_338._0_8_;
                      }
                    }
                    if ((double)local_230 <= dVar33) {
                      std::
                      _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                      ::_M_insert_unique<double_const&>
                                ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                                  *)local_2b8,(double *)local_2f8);
                    }
                  }
                  iVar29 = iVar29 + 10;
                } while ((float)iVar29 < local_228);
              }
              pcVar3 = local_1f0;
              p_Var22 = local_2a0;
              if (local_2a0 != (_Rb_tree_node_base *)(local_2b8 + 8)) {
                do {
                  local_338._0_8_ = *(double *)(p_Var22 + 1);
                  (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] = *(double *)(p_Var22 + 1);
                  pPVar37 = (Plotter *)Expr::operator()((Expr *)uVar35,env);
                  iVar7._M_current =
                       (this->pt_markers).
                       super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2f8._16_4_ = 5;
                  local_2f8._0_8_ = local_338._0_8_;
                  local_2f8._8_8_ = pPVar37;
                  if (local_352 == true) {
                    local_2f8._8_8_ = local_338._0_8_;
                    local_2f8._0_8_ = pPVar37;
                  }
                  local_2c8 = (pointer)((ulong)local_2c8 & 0xffffffffffffff00);
                  local_2f8._24_8_ = (bool *)0xffffffffffffffff;
                  pSStack_2d8 = (pointer)0xffffffffffffffff;
                  pSStack_2d0 = (pointer)0xffffffffffffffff;
                  if (iVar7._M_current ==
                      (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                    _M_realloc_insert<nivalis::PointMarker>
                              ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                *)pcVar3,iVar7,(PointMarker *)local_2f8);
                  }
                  else {
                    *(pointer *)&(iVar7._M_current)->passive = local_2c8;
                    (iVar7._M_current)->drag_var_x = 0xffffffffffffffff;
                    (iVar7._M_current)->drag_var_y = 0xffffffffffffffff;
                    *(undefined8 *)&(iVar7._M_current)->label = local_2f8._16_8_;
                    (iVar7._M_current)->rel_func = 0xffffffffffffffff;
                    (iVar7._M_current)->x = (double)local_2f8._0_8_;
                    (iVar7._M_current)->y = (double)local_2f8._8_8_;
                    ppPVar1 = &(this->pt_markers).
                               super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppPVar1 = *ppPVar1 + 1;
                  }
                  p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
                } while (p_Var22 != (_Rb_tree_node_base *)(local_2b8 + 8));
              }
LAB_001447fa:
              std::
              _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
              ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                           *)local_2b8);
            }
          }
          else {
            if (uVar27 + uVar18 != 8) goto LAB_00144841;
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       local_288,&pFVar34[(long)pbVar30].expr.ast);
            uVar20 = (ulong)this->x_var;
            if (uVar19 == uVar20) {
              uVar20 = (ulong)this->y_var;
            }
            local_338._0_8_ = uVar20;
            Expr::sub_var((Expr *)local_288,(uint32_t)uVar20,(Expr *)local_328._0_8_);
            AVar50 = Expr::ASTNode::varref(uVar19);
            local_f0._8_8_ = AVar50.field_1;
            local_f0._0_4_ = AVar50.opcode;
            __l._M_len = 1;
            __l._M_array = (iterator)local_f0;
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                      (&local_258.ast,__l,&local_259);
            Expr::Expr((Expr *)local_2b8,&local_258.ast);
            Expr::operator-((Expr *)local_2f8,(Expr *)local_288,(Expr *)local_2b8);
            uVar12 = local_288._16_8_;
            uVar35 = local_288._0_8_;
            local_288._0_8_ = local_2f8._0_8_;
            local_288._8_8_ = local_2f8._8_8_;
            local_288._16_8_ = local_2f8._16_8_;
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_8_ = (pointer)0x0;
            local_2f8._16_8_ = 0;
            if ((Plotter *)uVar35 != (Plotter *)0x0) {
              operator_delete((void *)uVar35,uVar12 - uVar35);
            }
            if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
            }
            if ((_Base_ptr)local_2b8._0_8_ != (_Base_ptr)0x0) {
              operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
            }
            if (local_258.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_258.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_258.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_258.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            Expr::optimize((Expr *)local_288,5);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                      (&local_258.ast,&pEVar31->ast);
            Expr::sub_var(&local_258,local_338._0_4_,(Expr *)local_328._0_8_);
            Expr::operator*((Expr *)local_2b8,&local_258,local_270);
            Expr::constant((Expr *)local_f0,1.0);
            Expr::operator-((Expr *)local_2f8,(Expr *)local_2b8,(Expr *)local_f0);
            pAVar14 = local_258.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pAVar13 = local_258.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_258.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8._0_8_;
            local_258.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2f8._8_8_;
            local_258.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8._16_8_;
            local_2f8._0_8_ = (Plotter *)0x0;
            local_2f8._8_8_ = (Plotter *)0x0;
            local_2f8._16_8_ = (pointer)0x0;
            if (pAVar13 != (pointer)0x0) {
              operator_delete(pAVar13,(long)pAVar14 - (long)pAVar13);
            }
            if ((Plotter *)local_2f8._0_8_ != (Plotter *)0x0) {
              operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
            }
            pvVar11 = (void *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
            if (pvVar11 != (void *)0x0) {
              operator_delete(pvVar11,local_f0._16_8_ - (long)pvVar11);
            }
            if ((_Base_ptr)local_2b8._0_8_ != (_Base_ptr)0x0) {
              operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
            }
            Expr::optimize(&local_258,5);
            bVar16 = Expr::is_null(&local_258);
            if (!bVar16) {
              local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffff00000000;
              local_2a8 = (_Rb_tree_node_base *)0x0;
              local_2a0 = (_Rb_tree_node_base *)(local_2b8 + 8);
              local_290._M_p = (pointer)0x0;
              local_298 = local_2a0;
              if (0.0 < local_228) {
                iVar29 = 0;
                do {
                  if (local_352 == true) {
                    iVar17 = (this->view).shigh;
                    dVar33 = (this->view).ymin;
                    dVar36 = ((this->view).ymax - dVar33) * (double)(iVar17 - iVar29);
                  }
                  else {
                    dVar33 = (this->view).xmin;
                    dVar36 = ((this->view).xmax - dVar33) * (double)iVar29;
                    iVar17 = (this->view).swid;
                  }
                  local_2f8._0_8_ =
                       Expr::newton((Expr *)local_288,uVar19,dVar36 / (double)iVar17 + dVar33,env,
                                    (double)local_318,(double)local_308,100,
                                    (double)local_348 - (double)local_1f8,
                                    (double)local_340 + (double)local_1f8,&local_258,
                                    1.79769313486232e+308,1.79769313486232e+308);
                  if ((((local_2f8._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                      ((double)local_348 <= (double)local_2f8._0_8_)) &&
                     ((double)local_2f8._0_8_ <= (double)local_340)) {
                    p_Var22 = (_Rb_tree_node_base *)(local_2b8 + 8);
                    for (p_Var23 = local_2a8; p_Var23 != (_Rb_tree_node_base *)0x0;
                        p_Var23 = (&p_Var23->_M_left)[bVar8 && bVar16]) {
                      bVar16 = (double)local_2f8._0_8_ != *(double *)(p_Var23 + 1);
                      bVar8 = *(double *)(p_Var23 + 1) <= (double)local_2f8._0_8_;
                      if (!bVar8 || !bVar16) {
                        p_Var22 = p_Var23;
                      }
                    }
                    dVar33 = 1.0;
                    if (p_Var22 != (_Rb_tree_node_base *)(local_2b8 + 8)) {
                      dVar33 = *(double *)(p_Var22 + 1) - (double)local_2f8._0_8_;
                    }
                    if (p_Var22 != local_2a0) {
                      local_338._0_8_ = dVar33;
                      local_310 = (Plotter *)local_2f8._0_8_;
                      lVar28 = std::_Rb_tree_decrement(p_Var22);
                      dVar33 = (double)local_310 - *(double *)(lVar28 + 0x20);
                      if ((double)local_338._0_8_ <= dVar33) {
                        dVar33 = (double)local_338._0_8_;
                      }
                    }
                    if ((double)local_230 <= dVar33) {
                      std::
                      _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                      ::_M_insert_unique<double_const&>
                                ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                                  *)local_2b8,(double *)local_2f8);
                    }
                  }
                  iVar29 = iVar29 + 2;
                } while ((float)iVar29 < local_228);
              }
              pcVar3 = local_1f0;
              p_Var22 = local_2a0;
              if (local_2a0 != (_Rb_tree_node_base *)(local_2b8 + 8)) {
                do {
                  local_338._0_8_ = *(double *)(p_Var22 + 1);
                  (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] = *(double *)(p_Var22 + 1);
                  pPVar37 = (Plotter *)Expr::operator()((Expr *)local_328._0_8_,env);
                  iVar7._M_current =
                       (this->pt_markers).
                       super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2f8._16_4_ = 5;
                  local_2f8._0_8_ = local_338._0_8_;
                  local_2f8._8_8_ = pPVar37;
                  if (local_352 == true) {
                    local_2f8._8_8_ = local_338._0_8_;
                    local_2f8._0_8_ = pPVar37;
                  }
                  local_2c8 = (pointer)((ulong)local_2c8 & 0xffffffffffffff00);
                  local_2f8._24_8_ = (bool *)0xffffffffffffffff;
                  pSStack_2d8 = (pointer)0xffffffffffffffff;
                  pSStack_2d0 = (pointer)0xffffffffffffffff;
                  if (iVar7._M_current ==
                      (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                    _M_realloc_insert<nivalis::PointMarker>
                              ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                *)pcVar3,iVar7,(PointMarker *)local_2f8);
                  }
                  else {
                    *(pointer *)&(iVar7._M_current)->passive = local_2c8;
                    (iVar7._M_current)->drag_var_x = 0xffffffffffffffff;
                    (iVar7._M_current)->drag_var_y = 0xffffffffffffffff;
                    *(undefined8 *)&(iVar7._M_current)->label = local_2f8._16_8_;
                    (iVar7._M_current)->rel_func = 0xffffffffffffffff;
                    (iVar7._M_current)->x = (double)local_2f8._0_8_;
                    (iVar7._M_current)->y = (double)local_2f8._8_8_;
                    ppPVar1 = &(this->pt_markers).
                               super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppPVar1 = *ppPVar1 + 1;
                  }
                  p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
                } while (p_Var22 != (_Rb_tree_node_base *)(local_2b8 + 8));
              }
              goto LAB_001447fa;
            }
          }
          if (local_258.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_258.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_258.ast.
                                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_258.ast.
                                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((Plotter *)local_288._0_8_ != (Plotter *)0x0) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
          }
        }
LAB_00144841:
        pFVar34 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pbVar25 = (pointer)(((long)(this->funcs).
                                   super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar34 >> 4)
                           * -0x79435e50d79435e5);
        if (pbVar25 < (pointer)this->max_functions_find_all_crit_points ||
            (long)pbVar25 - (long)this->max_functions_find_all_crit_points == 0) {
          pbVar25 = (pointer)local_1e8._0_8_;
        }
        pbVar30 = (pointer)((long)&(pbVar30->_M_dataplus)._M_p + 1);
      } while (pbVar30 < pbVar25);
    }
  }
  if ((pointer)local_108.
               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
               *)local_180);
  std::
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
               *)local_150);
  return;
}

Assistant:

void Plotter::plot_explicit(size_t funcid, bool reverse_xy) {
    const bool find_all_crit_pts = funcs.size() <= max_functions_find_all_crit_points
                                     || funcid == curr_func;

    double xdiff = view.xmax - view.xmin, ydiff = view.ymax - view.ymin;
    float swid = view.swid, shigh = view.shigh;
    double xmin = view.xmin, xmax = view.xmax;
    double ymin = view.ymin, ymax = view.ymax;
    uint64_t var = x_var;
    if (reverse_xy) {
        std::swap(xdiff, ydiff);
        std::swap(xmin, ymin);
        std::swap(xmax, ymax);
        std::swap(swid, shigh);
        var = y_var;
    }
    auto& func = funcs[funcid];
    color::color ineq_color = get_ineq_color(func.line_color);


    // Constants
    // Newton's method parameters
    const double EPS_STEP  = 1e-7 * xdiff;
    const double EPS_ABS   = 1e-10 * ydiff;
    static const int MAX_ITER  = 100;
    // Shorthand for Newton's method arguments
#define NEWTON_ARGS var, x, env, EPS_STEP, EPS_ABS, MAX_ITER, \
    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW
    // Amount x-coordinate is allowed to exceed the display boundaries
    const double NEWTON_SIDE_ALLOW = xdiff / 20.;


    // x-epsilon for domain bisection
    // (finding cutoff where function becomes undefined)
    const double DOMAIN_BISECTION_EPS = 1e-9 * xdiff;

    // Asymptote check constants:
    // Assume asymptote at discontinuity if slope between
    // x + ASYMPTOTE_CHECK_DELTA1, x + ASYMPTOTE_CHECK_DELTA2
    const double ASYMPTOTE_CHECK_DELTA1 = xdiff * 1e-6;
    const double ASYMPTOTE_CHECK_DELTA2 = xdiff * 1e-5;
    const double ASYMPTOTE_CHECK_EPS    = ydiff * 1e-9;
    // Special eps for boundary of domain
    const double ASYMPTOTE_CHECK_BOUNDARY_EPS = ydiff * 1e-3;

    // For explicit functions
    // We will draw a function segment between every pair of adjacent
    // discontinuities (including 'edge of screen')
    // x-coordinate after a discontinuity to begin drawing function
    const float DISCONTINUITY_EPS = 1e-4f * xdiff;

    // Minimum x-distance between critical points
    const double MIN_DIST_BETWEEN_ROOTS  = 1e-7 * xdiff;

    env.vars[y_var] = std::numeric_limits<double>::quiet_NaN();
    // Discontinuity/root/extremum type enum
    enum {
        DISCONT_ASYMPT = 0, // asymptote (in middle of domain, e.g. 0 of 1/x)
        DISCONT_DOMAIN,     // domain boundary (possibly asymptote, e.g. 0 of ln(x))
        DISCONT_SCREEN,     // edge of screen
        ROOT,               // root
        EXTREMUM,           // extremum
        Y_INT,              // y-intercept
    };
    // CritPoint: discontinuity/root/extremum type
    // first: x-position second: enum
    using CritPoint = std::pair<double, int>;
    // Store discontinuities
    std::set<CritPoint> discont, roots_and_extrema;
    size_t idx = 0;
    // Push check helpers
    // Push to st if no other item less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_if_valid = [&](double value, std::set<double>& st) {
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(value);
            double cdist = 1.;
            if (it != st.end()) cdist = *it - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - *itp);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) st.insert(value);
        }
    };
    // Push (value, type) to discont if no other distcontinuity's first item
    // is less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_critpt_if_valid = [&](double value,
            CritPoint::second_type type,
            std::set<CritPoint>& st) {
        auto vc = CritPoint(value, type);
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(vc);
            double cdist = 1.;
            if (it != st.end())
                cdist = it->first - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - itp->first);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) {
                st.insert(vc);
            }
        }
    };

    // Stores points in current line, which will be drawn as a polyline
    std::vector<std::array<float, 2> > curr_line;
    // Draw a line and construct markers along the line
    // to allow clicking
    auto draw_line = [&](float psx, float psy, float sx, float sy) {
        if (reverse_xy) {
            std::swap(sx, sy);
            std::swap(psx, psy);
        }
        // Draw the line
        if (curr_line.empty() ||
                (psx > curr_line.back()[0] || psy != curr_line.back()[1])) {
            if (curr_line.size() > 1 &&
                    (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
            }
            curr_line.resize(2);
            curr_line[0] = {psx, psy};
            curr_line[1] = {sx, sy};
        } else {
            curr_line.push_back({sx, sy});
        }
        // Draw inequality region
        if (func.type & Function::FUNC_TYPE_MOD_INEQ) {
            if (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            0, psy, sx, sy - psy, true, ineq_color, 0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, sy, sx - psx, view.shigh - sy, true, ineq_color,
                            0.0f, funcid);
                }
            } else {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, psy, view.swid - psx, sy - psy, true, ineq_color,
                            0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, 0, sx - psx, sy, true, ineq_color, 0.0f,
                            funcid);
                }
            }
        }
    };
    // ** Find roots, asymptotes, extrema
    if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
        double prev_x, prev_y = 0.;
        for (int sx = 0; sx < swid; sx += 4) {
            const double x = reverse_xy ? _SY_TO_Y(sx) : _SX_TO_X(sx);
            env.vars[var] = x;
            double y = func.expr(env);
            const bool is_y_nan = std::isnan(y);

            if (!is_y_nan) {
                env.vars[var] = x;
                double dy = func.diff(env);
                if (!std::isnan(dy)) {
                    if (find_all_crit_pts) {
                        double root = func.expr.newton(NEWTON_ARGS, &func.diff, y, dy);
                        push_critpt_if_valid(root, ROOT, roots_and_extrema);
                    }
                    double asymp = func.recip.newton(NEWTON_ARGS,
                            &func.drecip, 1. / y, -dy / (y*y));
                    push_critpt_if_valid(asymp, DISCONT_ASYMPT, discont);

                    if (find_all_crit_pts) {
                        env.vars[var] = x;
                        double ddy = func.ddiff(env);
                        if (!std::isnan(ddy)) {
                            double extr = func.diff.newton(NEWTON_ARGS,
                                    &func.ddiff, dy, ddy);
                            push_critpt_if_valid(extr, EXTREMUM, roots_and_extrema);
                        }
                    }
                }
            }
            if (sx) {
                const bool is_prev_y_nan = std::isnan(prev_y);
                if (is_y_nan != is_prev_y_nan) {
                    // Search for cutoff via bisection
                    double lo = prev_x, hi = x;
                    while (hi - lo > DOMAIN_BISECTION_EPS) {
                        double mi = (lo + hi) * 0.5;
                        env.vars[var] = mi; double mi_y = func.expr(env);
                        if (std::isnan(mi_y) == is_prev_y_nan) {
                            lo = mi;
                        } else {
                            hi = mi;
                        }
                    }
                    double boundary_x_not_nan_side = is_prev_y_nan ? hi : lo;
                    push_critpt_if_valid(boundary_x_not_nan_side,
                            DISCONT_DOMAIN, discont);
                }
            }
            prev_x = x; prev_y = y;
        }
    }
    // Add screen edges to discontinuities list for convenience
    discont.emplace(xmin, DISCONT_SCREEN);
    discont.emplace(xmax, DISCONT_SCREEN);

    // Previous discontinuity infop
    double prev_discont_x = xmin;
    float prev_discont_sx;
    int prev_discont_type;
    size_t as_idx = 0;

    // ** Main explicit func drawing code: draw function from discont to discont
    for (const auto& discontinuity : discont) {
        float psx = -1.f, psy = -1.f;
        double discont_x = discontinuity.first;
        int discont_type = discontinuity.second;
        float discont_sx = reverse_xy ? _Y_TO_SY(discont_x) : _X_TO_SX(discont_x);

        if (as_idx > 0) {
            bool connector = prev_discont_type != DISCONT_SCREEN;
            double x_begin = prev_discont_x, x_end = discont_x;
            float sx_begin = prev_discont_sx, sx_end = discont_sx;
            if (reverse_xy) {
                std::swap(sx_begin, sx_end);
                std::swap(x_begin, x_end);
            }
            // Draw func between asymptotes
            for (float sxd = sx_begin + DISCONTINUITY_EPS; sxd < sx_end - DISCONTINUITY_EPS;) {
                const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                env.vars[var] = x;
                double y = func.expr(env);

                if (!std::isnan(y)) {
                    if (y > ymax + ydiff) y = ymax + ydiff;
                    else if (y < ymin - ydiff) y = ymin - ydiff;
                    float sy = reverse_xy ?  _X_TO_SX(y) : _Y_TO_SY(y), sx = sxd;
                    if (connector) {
                        // Check if asymptote at previous position;
                        // if so then connect it
                        connector = false;
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA1;
                        double yp = func.expr(env);
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA2;
                        double yp2 = func.expr(env);
                        double eps = discont_type == DISCONT_ASYMPT ?
                            ASYMPTOTE_CHECK_EPS:
                            ASYMPTOTE_CHECK_BOUNDARY_EPS;
                        if (yp - yp2 > eps && sy > 0.f) {
                            psx = sx_begin;
                            psy = 0.f;
                        } else if (yp - yp2 < -eps && sy < (float)shigh) {
                            psx = sx_begin;
                            psy = static_cast<float>(shigh);
                        }
                    }
                    if (psx >= 0.0) draw_line(psx, psy, sx, sy);
                    psx = sx;
                    psy = sy;
                } else {
                    psx = -1;
                }
                if (discont.size() > 2 && discont.size() < 100) {
                    if ((as_idx > 1 && sxd - prev_discont_sx < 1.) ||
                            (as_idx < discont.size() - 1 && discont_sx - sxd < 1.)) {
                        sxd += 0.1f;
                    } else {
                        sxd += 0.2f;
                    }
                } else {
                    sxd += 0.2f;
                }
            }
            // Connect next asymptote
            if (discont_type != DISCONT_SCREEN) {
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA1;
                double yp = func.expr(env);
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA2;
                double yp2 = func.expr(env);
                float sx = -1, sy;
                double eps = discont_type == DISCONT_ASYMPT ?
                    ASYMPTOTE_CHECK_EPS:
                    ASYMPTOTE_CHECK_BOUNDARY_EPS;
                if (yp - yp2 > eps && psy > 0) {
                    sx = static_cast<float>(sx_end);
                    sy = 0.f;
                }
                if (yp - yp2 < -eps && psy < shigh) {
                    sx = sx_end;
                    sy = static_cast<float>(shigh);
                }
                if (psx >= 0.f && sx >= 0.f) {
                    draw_line(psx, psy, sx, sy);
                }
            }
        }
        ++as_idx;
        prev_discont_x = discont_x;
        prev_discont_type = discont_type;
        prev_discont_sx = discont_sx;
    }

    // Finish last line, if exists
    if (curr_line.size() > 1 && (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
        buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
    }
    if (funcs.size() <= max_functions_find_crit_points) {
        if (find_all_crit_pts) {
            std::vector<CritPoint> to_erase; // Save dubious points to delete from roots_and_extrama
            // Helper to draw roots/extrema/y-int and add a marker for it
            auto draw_extremum = [&](const CritPoint& cpt, double y) {
                env.vars[var] = cpt.first;
                double dy = func.diff(env);
                double ddy = func.ddiff(env);
                double x; int type;
                std::tie(x, type) = cpt;
                auto label =
                    type == Y_INT ? (reverse_xy ? PointMarker::LABEL_X_INT : PointMarker::LABEL_Y_INT) :
                    type == ROOT ? (reverse_xy ? PointMarker::LABEL_Y_INT : PointMarker::LABEL_X_INT) :
                    (type == EXTREMUM && ddy > 1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MIN :
                    (type == EXTREMUM && ddy < -1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MAX:
                    type == EXTREMUM ? PointMarker::LABEL_INFLECTION_PT:
                    PointMarker::LABEL_NONE;
                // Do not show
                if (label == PointMarker::LABEL_INFLECTION_PT ||
                        label == PointMarker::LABEL_NONE) {
                    to_erase.push_back(cpt);
                    return;
                }

                PointMarker ptm;
                ptm.label = label;
                ptm.y = y; ptm.x = x;
                if (reverse_xy) std::swap(ptm.x, ptm.y);
                if (type == Y_INT) label = PointMarker::LABEL_X_INT;
                else if (type == ROOT) label = PointMarker::LABEL_Y_INT;
                ptm.passive = false;
                ptm.rel_func = funcid;
                ptm.drag_var_x = ptm.drag_var_y = -1;
                pt_markers.push_back(std::move(ptm));
            };
            for (const CritPoint& cpt : roots_and_extrema) {
                env.vars[var] = cpt.first;
                double y = func.expr(env);
                draw_extremum(cpt, y);
            }
            // Delete the "dubious" points
            for (const CritPoint& x : to_erase) {
                roots_and_extrema.erase(x);
            }
            if (!func.expr.is_null() && !func.diff.is_null()) {
                env.vars[var] = 0;
                double y = func.expr(env);
                if (!std::isnan(y) && !std::isinf(y)) {
                    push_critpt_if_valid(0., Y_INT, roots_and_extrema); // y-int
                    auto cpt = CritPoint(0., Y_INT);
                    if (roots_and_extrema.count(cpt)) {
                        draw_extremum(cpt, y);
                    }
                }
            }
        }

        // Function intersection
        if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
            if (find_all_crit_pts) {
                for (size_t funcid2 = 0; funcid2 < (funcs.size() <= max_functions_find_all_crit_points
                                                    ? funcid : funcs.size()); ++funcid2) {
                    auto& func2 = funcs[funcid2];
                    if (func2.diff.is_null()) continue;
                    int ft_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
                    int f2t_nomod = func2.type & ~Function::FUNC_TYPE_MOD_ALL;
                    if (ft_nomod == f2t_nomod) {
                        // Same direction, use Newton on difference.
                        Expr sub_expr = func.expr - func2.expr;
                        Expr diff_sub_expr = func.diff - func2.diff;
                        // diff_sub_expr.optimize();
                        if (diff_sub_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 10) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = sub_expr.newton(NEWTON_ARGS, &diff_sub_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } else if (ft_nomod + f2t_nomod == 8) {
                        // Inverse direction, use Newton on composition.
                        Expr comp_expr = func2.expr;
                        auto other_var = var == x_var ? y_var  : x_var;
                        comp_expr.sub_var(other_var, func.expr);
                        comp_expr = comp_expr - Expr::AST{Expr::ASTNode::varref(var)};
                        comp_expr.optimize();

                        Expr diff_comp_expr = func2.diff;
                        diff_comp_expr.sub_var(other_var, func.expr);
                        diff_comp_expr = diff_comp_expr * func.diff - Expr::constant(1.);
                        diff_comp_expr.optimize();
                        if (diff_comp_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 2) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = comp_expr.newton(
                                    var, x, env, EPS_STEP * 10.f, EPS_ABS * 10.f, MAX_ITER,
                                    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW,
                                    &diff_comp_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } // if
                    // o.w. not supported.
                } // for funcid2
            } // if (find_all_intersections || funcid == curr_func)
        } // if (!func.diff.is_null())
    } // if (funcs.size() <= max_functions_find_crit_points)
    // * End of function intersection code
}